

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

void prf_state_destroy(prf_state_t *state)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = prf_array_count(state->matrix);
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    free(state->matrix[uVar3]);
  }
  free(state->inv_matrix);
  prf_array_free(state->materials);
  prf_array_free(state->textures);
  prf_array_free(state->instances);
  prf_array_free(state->matrix);
  free(state);
  return;
}

Assistant:

void
prf_state_destroy(
    prf_state_t * state )
{
    int cnt, i;
    assert( state != NULL );
    cnt = prf_array_count( state->matrix );
    for ( i = 0; i < cnt; i++ )
        free( state->matrix[i] );
    free( state->inv_matrix );
    prf_array_free( state->materials );
    prf_array_free( state->textures );
    prf_array_free( state->instances );
    prf_array_free( state->matrix );
    free( state );
}